

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O0

Raster * rw::gl3::rasterCreate(Raster *raster)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Error local_30;
  Error _e;
  Raster *ret;
  Gl3Raster *natras;
  Raster *raster_local;
  
  iVar1 = nativeRasterOffset;
  *(undefined1 *)((long)&raster->width + (long)nativeRasterOffset) = 0;
  *(undefined1 *)((long)&raster->width + (long)iVar1 + 1) = 0;
  *(undefined1 *)((long)&raster->width + (long)iVar1 + 3) = 1;
  if ((raster->width == 0) || (raster->height == 0)) {
    raster->flags = raster->flags | 0x80;
    raster->stride = 0;
  }
  else if ((raster->flags & 0x80U) == 0) {
    local_30.plugin = 0xb00;
    local_30.code = 0x8000000a;
    _e = (Error)raster;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/gl3raster.cpp",
            0x1a9);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x8000000a);
    fprintf(__stream,"%s\n",pcVar2);
    setError(&local_30);
    return (Raster *)0x0;
  }
  raster->originalWidth = raster->width;
  raster->originalHeight = raster->height;
  raster->originalStride = raster->stride;
  raster->originalPixels = raster->pixels;
  return raster;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	natras->isCompressed = 0;
	natras->hasAlpha = 0;
	natras->numLevels = 1;

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
#ifdef RW_OPENGL
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}